

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsLoads.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsElasticGear::ChShaftsElasticGear
          (ChShaftsElasticGear *this,shared_ptr<chrono::ChShaft> *mshaftA,
          shared_ptr<chrono::ChShaft> *mshaftB,double mstiffness,double mdamping,double mRa,
          double mratio)

{
  element_type *peVar1;
  shared_ptr<chrono::ChLoadable> local_48;
  shared_ptr<chrono::ChLoadable> local_38;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  peVar1 = (mshaftA->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &peVar1->super_ChLoadable;
  if (peVar1 == (element_type *)0x0) {
    local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ChLoadable *)0x0;
  }
  local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mshaftA->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  peVar1 = (mshaftB->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &peVar1->super_ChLoadable;
  if (peVar1 == (element_type *)0x0) {
    local_48.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ChLoadable *)0x0;
  }
  local_48.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mshaftB->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_48.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_48.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_48.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_28 = mstiffness;
  local_20 = mdamping;
  local_18 = mRa;
  local_10 = mratio;
  ChLoadCustomMultiple::ChLoadCustomMultiple(&this->super_ChLoadCustomMultiple,&local_38,&local_48);
  if (local_48.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustomMultiple_00b4cf18;
  this->stiffness = local_28;
  this->damping = local_20;
  this->rest_phase = 0.0;
  this->Ra = local_18;
  this->ratio = local_10;
  this->contact_force = 0.0;
  return;
}

Assistant:

chrono::ChShaftsElasticGear::ChShaftsElasticGear(
    std::shared_ptr<ChShaft> mshaftA,  ///< shaft A
    std::shared_ptr<ChShaft> mshaftB,  ///< shaft B
    const double mstiffness,           ///< normal stiffness at teeth contact, tangent direction to primitive
    const double mdamping,             ///< normal damping at teeth contact, tangent direction to primitive
    const double mRa,                  ///< primitive radius of the gear on shaft A (the radius of B is not needed)
    const double mratio)
    : ChLoadCustomMultiple(mshaftA, mshaftB),
      stiffness(mstiffness),
      damping(mdamping),
      rest_phase(0.0),
      Ra(mRa),
      ratio(mratio) {
    contact_force = 0.0;
}